

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

void __thiscall randomx::Instruction::h_IMULH_R(Instruction *this,ostream *os)

{
  byte bVar1;
  byte bVar2;
  ostream *this_00;
  long *plVar3;
  
  bVar1 = this->dst;
  bVar2 = this->src;
  std::__ostream_insert<char,std::char_traits<char>>(os,"r",1);
  this_00 = (ostream *)std::ostream::operator<<(os,bVar1 & 7);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,", r",3);
  plVar3 = (long *)std::ostream::operator<<(this_00,bVar2 & 7);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void Instruction::h_IMULH_R(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		os << "r" << dstIndex << ", r" << srcIndex << std::endl;
	}